

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.h
# Opt level: O3

void UnserializeTransaction<ParamsStream<DataStream&,TransactionSerParams>,CMutableTransaction>
               (CMutableTransaction *tx,ParamsStream<DataStream_&,_TransactionSerParams> *s,
               TransactionSerParams *params)

{
  vector<CTxOut,_std::allocator<CTxOut>_> *this;
  _Vector_impl_data *p_Var1;
  bool bVar2;
  pointer pvVar3;
  VectorFormatter<DefaultFormatter> VVar4;
  uint32_t uVar5;
  ulong uVar6;
  char *pcVar7;
  size_t in_RCX;
  pointer pCVar8;
  pointer pCVar9;
  pointer *ppvVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long in_FS_OFFSET;
  uint32_t obj;
  uint32_t local_48 [2];
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = params->allow_witness;
  DataStream::read(s->m_substream,(int)local_48,(void *)0x4,in_RCX);
  tx->version = local_48[0];
  std::vector<CTxIn,_std::allocator<CTxIn>_>::_M_erase_at_end
            (&tx->vin,(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start);
  this = &tx->vout;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::_M_erase_at_end
            (this,(tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_start);
  VectorFormatter<DefaultFormatter>::
  Unser<ParamsStream<DataStream&,TransactionSerParams>,std::vector<CTxIn,std::allocator<CTxIn>>>
            ((VectorFormatter<DefaultFormatter> *)local_48,s,&tx->vin);
  if (((tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
       _M_finish ==
       (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
       _M_start) && (bVar2 != false)) {
    DataStream::read(s->m_substream,(int)local_48,(void *)0x1,in_RCX);
    uVar5 = local_48[0];
    VVar4 = local_48[0]._0_1_;
    if (local_48[0]._0_1_ != (VectorFormatter<DefaultFormatter>)0x0) {
      VectorFormatter<DefaultFormatter>::
      Unser<ParamsStream<DataStream&,TransactionSerParams>,std::vector<CTxIn,std::allocator<CTxIn>>>
                ((VectorFormatter<DefaultFormatter> *)local_48,s,&tx->vin);
      VectorFormatter<DefaultFormatter>::
      Unser<ParamsStream<DataStream&,TransactionSerParams>,std::vector<CTxOut,std::allocator<CTxOut>>>
                ((VectorFormatter<DefaultFormatter> *)local_48,s,this);
      if ((uVar5 & 1) == 0) {
LAB_002db817:
        pcVar7 = (char *)__cxa_allocate_exception(0x20);
        local_40 = std::iostream_category();
        local_48[0] = 1;
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar7,(error_code *)"Unknown transaction optional data");
      }
      else {
        pCVar9 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pCVar8 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pCVar8 == pCVar9) {
          uVar6 = 0;
        }
        else {
          lVar13 = 0x50;
          uVar11 = 0;
          do {
            VectorFormatter<DefaultFormatter>::
            Unser<ParamsStream<DataStream&,TransactionSerParams>,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                      ((VectorFormatter<DefaultFormatter> *)local_48,s,
                       (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)((pCVar9->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          lVar13));
            uVar11 = uVar11 + 1;
            pCVar9 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pCVar8 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            uVar6 = ((long)pCVar8 - (long)pCVar9 >> 3) * 0x4ec4ec4ec4ec4ec5;
            lVar13 = lVar13 + 0x68;
          } while (uVar11 < uVar6);
        }
        if (pCVar8 != pCVar9) {
          in_RCX = uVar6 + (uVar6 == 0);
          if ((pCVar9->scriptWitness).stack.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              (pCVar9->scriptWitness).stack.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            ppvVar10 = &pCVar9[1].scriptWitness.stack.
                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            uVar11 = 1;
            do {
              uVar12 = uVar11;
              if (in_RCX == uVar12) break;
              p_Var1 = (_Vector_impl_data *)(ppvVar10 + -1);
              pvVar3 = *ppvVar10;
              ppvVar10 = ppvVar10 + 0xd;
              uVar11 = uVar12 + 1;
            } while (p_Var1->_M_start == pvVar3);
            if (uVar6 <= uVar12) goto LAB_002db849;
          }
          if (VVar4 == (VectorFormatter<DefaultFormatter>)0x1) goto LAB_002db7d8;
          goto LAB_002db817;
        }
LAB_002db849:
        pcVar7 = (char *)__cxa_allocate_exception(0x20);
        local_40 = std::iostream_category();
        local_48[0] = 1;
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar7,(error_code *)"Superfluous witness record");
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pcVar7,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
      goto LAB_002db8cc;
    }
  }
  else {
    VectorFormatter<DefaultFormatter>::
    Unser<ParamsStream<DataStream&,TransactionSerParams>,std::vector<CTxOut,std::allocator<CTxOut>>>
              ((VectorFormatter<DefaultFormatter> *)local_48,s,this);
  }
LAB_002db7d8:
  DataStream::read(s->m_substream,(int)local_48,(void *)0x4,in_RCX);
  tx->nLockTime = local_48[0];
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_002db8cc:
  __stack_chk_fail();
}

Assistant:

void UnserializeTransaction(TxType& tx, Stream& s, const TransactionSerParams& params)
{
    const bool fAllowWitness = params.allow_witness;

    s >> tx.version;
    unsigned char flags = 0;
    tx.vin.clear();
    tx.vout.clear();
    /* Try to read the vin. In case the dummy is there, this will be read as an empty vector. */
    s >> tx.vin;
    if (tx.vin.size() == 0 && fAllowWitness) {
        /* We read a dummy or an empty vin. */
        s >> flags;
        if (flags != 0) {
            s >> tx.vin;
            s >> tx.vout;
        }
    } else {
        /* We read a non-empty vin. Assume a normal vout follows. */
        s >> tx.vout;
    }
    if ((flags & 1) && fAllowWitness) {
        /* The witness flag is present, and we support witnesses. */
        flags ^= 1;
        for (size_t i = 0; i < tx.vin.size(); i++) {
            s >> tx.vin[i].scriptWitness.stack;
        }
        if (!tx.HasWitness()) {
            /* It's illegal to encode witnesses when all witness stacks are empty. */
            throw std::ios_base::failure("Superfluous witness record");
        }
    }
    if (flags) {
        /* Unknown flag in the serialization */
        throw std::ios_base::failure("Unknown transaction optional data");
    }
    s >> tx.nLockTime;
}